

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

void voc_parse_np(voccxdef *ctx)

{
  short *psVar1;
  vocoldef *pvVar2;
  ushort uVar3;
  ushort uVar4;
  vocoldef *pvVar5;
  runsdef *prVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  int32_t tmp;
  char **ppcVar10;
  char **ppcVar11;
  uint32_t tmp_5;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ushort *puVar15;
  int iVar16;
  int32_t tmp_2;
  objnum *poVar17;
  int32_t tmp_1;
  int iVar18;
  long lVar19;
  vocoldef *pvVar20;
  uchar *puVar21;
  uint16_t tmp_3;
  int iVar22;
  char **ppcVar23;
  ulong uVar24;
  ushort *puVar25;
  voccxdef *pvVar26;
  ushort *local_b8;
  uint local_ac;
  uint local_a8;
  int local_a4;
  voccxdef *local_a0;
  ushort *local_98;
  char **local_90;
  int local_88;
  int local_84;
  char **local_80;
  runcxdef *local_78;
  undefined8 local_70;
  undefined8 local_68;
  vocoldef *local_60;
  ulong local_58;
  int no_match;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pvVar5 = (vocoldef *)ctx->voc_stk_cur;
  if (pvVar5 + 200 <= (vocoldef *)ctx->voc_stk_end) {
    local_78 = ctx->voccxrun;
    ctx->voc_stk_cur = (uchar *)(pvVar5 + 200);
    local_48._0_4_ = ctx->voccxunknown;
    local_48._4_4_ = ctx->voccxlastunk;
    uStack_40 = 0;
    ctx->voccxunknown = 0;
    ctx->voccxlastunk = 0;
    prVar6 = local_78->runcxsp;
    local_78->runcxsp = prVar6 + -1;
    if (prVar6[-1].runstyp != '\a') {
LAB_001f42a7:
      local_78->runcxerr->errcxptr->erraac = 0;
      runsign(local_78,0x3fc);
    }
    puVar15 = (ushort *)prVar6[-1].runsv.runsvstr;
    uVar3 = *puVar15;
    local_78->runcxsp = prVar6 + -2;
    if (prVar6[-2].runstyp != '\a') goto LAB_001f42a7;
    puVar25 = (ushort *)prVar6[-2].runsv.runsvstr;
    uVar4 = *puVar25;
    uVar8 = (uint)uVar4;
    local_78->runcxsp = prVar6 + -3;
    if (prVar6[-3].runstyp != '\x01') {
      local_78->runcxerr->errcxptr->erraac = 0;
      runsign(local_78,0x3eb);
    }
    local_a4 = *(int *)&prVar6[-3].runsv + -1;
    local_78->runcxsp = prVar6 + -4;
    if (prVar6[-4].runstyp == '\x05') {
      local_88 = 0;
    }
    else {
      local_88 = 1;
      if (prVar6[-4].runstyp != '\b') goto LAB_001f3e18;
    }
    local_78->runcxsp = prVar6 + -5;
    if (prVar6[-5].runstyp == '\x05') {
      local_68 = 0;
    }
    else {
      local_68 = 1;
      if (prVar6[-5].runstyp != '\b') goto LAB_001f3e18;
    }
    local_78->runcxsp = prVar6 + -6;
    if (prVar6[-6].runstyp == '\x05') {
      local_70 = 0;
    }
    else {
      local_70 = 1;
      if (prVar6[-6].runstyp != '\b') {
LAB_001f3e18:
        local_78->runcxerr->errcxptr->erraac = 0;
        runsign(local_78,0x3ed);
      }
    }
    uVar12 = uVar3 - 2;
    puVar15 = puVar15 + 1;
    local_b8 = puVar15;
    local_ac = uVar12;
    local_a0 = ctx;
    local_84 = local_a4;
    local_60 = pvVar5;
    if (uVar12 == 0) {
      uVar24 = 0;
      uVar14 = 0;
    }
    else {
      local_a8 = (uint)uVar4;
      uVar14 = 0;
      iVar22 = 0;
      local_98 = puVar25;
      do {
        if ((char)*local_b8 == '\x03') {
          iVar22 = iVar22 + (uint)*(ushort *)((long)local_b8 + 1) + 1;
        }
        lstadv((uchar **)&local_b8,&local_ac);
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (local_ac != 0);
      uVar24 = (ulong)(iVar22 + 7U & 0xfffffff8);
      puVar25 = local_98;
      uVar8 = local_a8;
    }
    puVar21 = local_a0->voc_stk_cur;
    ppcVar11 = (char **)local_a0->voc_stk_end;
    ppcVar23 = (char **)(puVar21 + uVar24);
    ctx = local_a0;
    if (ppcVar23 <= ppcVar11) {
      local_a0->voc_stk_cur = (uchar *)ppcVar23;
      local_80 = (char **)((ulong)((int)uVar14 * 8 + 8) + (long)ppcVar23);
      if (local_80 <= ppcVar11) {
        local_a0->voc_stk_cur = (uchar *)local_80;
        ppcVar10 = (char **)((ulong)(((int)uVar14 + 1) * 4 + 7U & 0xfffffff8) + (long)local_80);
        local_90 = ppcVar23;
        if (ppcVar10 <= ppcVar11) {
          uVar24 = 0;
          local_a0->voc_stk_cur = (uchar *)ppcVar10;
          local_b8 = puVar25 + 1;
          local_ac = uVar8 - 2;
          if (uVar12 != 0) {
            local_b8 = puVar15;
            local_ac = uVar12;
            local_a8 = uVar8 - 2;
            local_98 = puVar25 + 1;
            local_58 = uVar14;
            do {
              if ((char)*local_b8 == '\x03') {
                local_90[(int)uVar24] = (char *)puVar21;
                uVar3 = *(ushort *)((long)local_b8 + 1);
                uVar14 = (ulong)(uVar3 - 2);
                memcpy(puVar21,(char *)((long)local_b8 + 3),uVar14);
                puVar21[uVar14] = '\0';
                puVar21 = puVar21 + (uVar3 - 1);
                uVar24 = (ulong)((int)uVar24 + 1);
                uVar14 = local_58;
              }
              lstadv((uchar **)&local_b8,&local_ac);
            } while (local_ac != 0);
            uVar24 = (ulong)(int)uVar24;
            local_b8 = local_98;
            local_ac = local_a8;
          }
          ppcVar11 = local_90;
          local_90[uVar24] = (char *)0x0;
          iVar22 = (int)uVar14;
          if (0 < iVar22 && local_ac != 0) {
            iVar13 = 0;
            do {
              if ((char)*local_b8 == '\x01') {
                *(undefined4 *)((long)local_80 + (long)iVar13 * 4) =
                     *(undefined4 *)((long)local_b8 + 1);
                iVar13 = iVar13 + 1;
              }
              lstadv((uchar **)&local_b8,&local_ac);
            } while ((local_ac != 0) && (iVar13 < iVar22));
          }
          pvVar5 = local_60;
          pvVar26 = local_a0;
          uVar8 = vocgobj(local_a0,ppcVar11,(int *)local_80,local_84,&local_a4,local_88,local_60,
                          (int)local_68,(int)local_70,&no_match);
          pvVar26->voccxunknown = (undefined4)local_48;
          pvVar26->voccxlastunk = local_48._4_4_;
          if ((int)uVar8 < 0) {
            runpnil(local_78);
          }
          else if (uVar8 == 0) {
            iVar22 = local_a4 + 1;
            puVar21 = voc_push_list_siz(pvVar26,5);
            *puVar21 = '\x01';
            *(int *)(puVar21 + 1) = iVar22;
          }
          else {
            lVar9 = 0;
            iVar13 = 0;
            do {
              iVar16 = iVar13;
              lVar9 = (long)(int)lVar9;
              ppcVar11 = &pvVar5[lVar9].vocolfst;
              pcVar7 = *ppcVar11;
              while (*ppcVar11 == pcVar7) {
                iVar16 = iVar16 + (uint)(((vocoldef *)(ppcVar11 + -1))->vocolobj != 0xffff) * 2 + 6;
                lVar9 = lVar9 + 1;
                ppcVar11 = ppcVar11 + 5;
                if ((long)(ulong)uVar8 <= lVar9) goto LAB_001f40d1;
              }
              iVar13 = iVar16 + 0xd;
            } while ((int)lVar9 < (int)uVar8);
LAB_001f40d1:
            local_ac = iVar16 + 0x12;
            puVar21 = voc_push_list_siz(pvVar26,local_ac);
            *puVar21 = '\x01';
            *(int *)(puVar21 + 1) = local_a4 + 1;
            local_b8 = (ushort *)(puVar21 + 5);
            iVar13 = 0;
            do {
              psVar1 = (short *)((long)local_b8 + 1);
              *(uchar *)local_b8 = '\a';
              lVar9 = (long)iVar13;
              if (iVar22 == 0) {
                iVar18 = -1;
                iVar16 = 0;
              }
              else {
                iVar18 = -1;
                uVar24 = 0;
                do {
                  iVar16 = (int)uVar24;
                  if (local_90[uVar24] != pvVar5[lVar9].vocolfst) {
                    iVar16 = iVar18;
                  }
                  iVar18 = iVar16;
                  pvVar26 = local_a0;
                  if (local_90[uVar24] == pvVar5[lVar9].vocollst) {
                    iVar16 = (int)uVar24 + 1;
                    goto LAB_001f417b;
                  }
                  uVar24 = uVar24 + 1;
                } while ((uVar14 & 0xffffffff) != uVar24);
                iVar16 = 0;
              }
LAB_001f417b:
              *(uchar *)((long)local_b8 + 3) = '\x01';
              *(int *)(local_b8 + 2) = iVar18 + 1;
              *(uchar *)(local_b8 + 4) = '\x01';
              *(int *)((long)local_b8 + 9) = iVar16;
              local_b8 = (ushort *)((long)local_b8 + 0xd);
              if (iVar13 < (int)uVar8) {
                pvVar2 = pvVar5 + lVar9;
                lVar19 = 0;
                pvVar20 = pvVar2;
                while (pvVar20->vocolfst == pvVar2->vocolfst) {
                  poVar17 = (objnum *)((long)local_b8 + 1);
                  if (pvVar20->vocolobj == 0xffff) {
                    *(uchar *)local_b8 = '\x05';
                  }
                  else {
                    *(uchar *)local_b8 = '\x02';
                    *poVar17 = pvVar20->vocolobj;
                    poVar17 = (objnum *)((long)local_b8 + 3);
                  }
                  *(uchar *)poVar17 = '\x01';
                  *(int *)((long)poVar17 + 1) = pvVar2->vocolflg;
                  local_b8 = (ushort *)((long)poVar17 + 5);
                  lVar19 = lVar19 + -1;
                  pvVar20 = pvVar20 + 1;
                  if (lVar9 - (ulong)uVar8 == lVar19) {
                    *psVar1 = (short)local_b8 - (short)psVar1;
                    goto LAB_001f427a;
                  }
                }
                iVar13 = iVar13 - (int)lVar19;
              }
              *psVar1 = (short)local_b8 - (short)psVar1;
            } while (iVar13 < (int)uVar8);
          }
LAB_001f427a:
          pvVar26->voc_stk_cur = (uchar *)pvVar5;
          return;
        }
      }
    }
  }
  errsigf(ctx->voccxerr,"TADS",0x417);
}

Assistant:

void voc_parse_np(voccxdef *ctx)
{
    runcxdef *rcx = ctx->voccxrun;
    vocoldef *objlist;
    uchar *save_sp;
    uchar *wordp;
    uint wordsiz;
    uchar *typp;
    uint typsiz;
    int cnt;
    char **wordarr;
    int wordcnt;
    char *wordchararr;
    uint wordcharsiz;
    int *typarr;
    int complain;
    int chkact;
    int multi;
    int no_match;
    int next;
    int cur;
    uchar *lstp;
    uint lstsiz;
    char *p;
    int i;
    int old_unknown, old_lastunk;

    /* allocate stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, objlist);

    /* 
     *   Save the original context unknown values, since we don't want to
     *   affect the context information in this game-initiated call, then
     *   clear the unknown word count for the duration of the call.  
     */
    old_unknown = ctx->voccxunknown;
    old_lastunk = ctx->voccxlastunk;
    ctx->voccxunknown = ctx->voccxlastunk = 0;

    /* get the list of words, and read its length prefix */
    wordp = runpoplst(rcx);
    wordsiz = osrp2(wordp) - 2;
    wordp += 2;

    /* get the list of types, and read its length prefix */
    typp = runpoplst(rcx);
    typsiz = osrp2(typp) - 2;
    typp += 2;

    /* get the starting index (adjusting for zero-based indexing) */
    cur = runpopnum(rcx) - 1;
    next = cur;

    /* get the flag arguments */
    complain = runpoplog(rcx);
    multi = runpoplog(rcx);
    chkact = runpoplog(rcx);

    /* count the words in the word list */
    for (wordcnt = 0, lstp = wordp, wordcharsiz = 0, lstsiz = wordsiz ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* count the word */
        ++wordcnt;

        /* 
         *   count the space needed for the word - count the bytes of the
         *   string plus a null terminator 
         */
        if (*lstp == DAT_SSTRING)
            wordcharsiz += osrp2(lstp+1) + 1;
    }

    /* allocate space for the word arrays */
    VOC_STK_ARRAY(ctx, char,   wordchararr, wordcharsiz);
    VOC_STK_ARRAY(ctx, char *, wordarr,     wordcnt+1);
    VOC_STK_ARRAY(ctx, int,    typarr,      wordcnt+1);

    /* build the word array */
    for (i = 0, p = wordchararr, lstp = wordp, lstsiz = wordsiz ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* add the word to the word array */
        if (*lstp == DAT_SSTRING)
        {
            uint len;
            
            /* add this entry to the word array */
            wordarr[i] = p;

            /* copy the word to the character array and null-terminate it */
            len = osrp2(lstp + 1) - 2;
            memcpy(p, lstp + 3, len);
            p[len] = '\0';

            /* move the write pointer past this entry */
            p += len + 1;

            /* bump the index */
            ++i;
        }
    }

    /* store an empty last entry */
    wordarr[i] = 0;

    /* build the type array */
    for (i = 0, lstp = typp, lstsiz = typsiz ;
         lstsiz != 0 && i < wordcnt ; lstadv(&lstp, &lstsiz))
    {
        /* add this entry to the type array */
        if (*lstp == DAT_NUMBER)
        {
            /* set the entry */
            typarr[i] = (int)osrp4(lstp + 1);

            /* bump the index */
            ++i;
        }
    }

    /* parse the noun phrase */
    cnt = vocgobj(ctx, wordarr, typarr, cur, &next, complain, objlist,
                  multi, chkact, &no_match);

    /* restore context unknown values */
    ctx->voccxunknown = old_unknown;
    ctx->voccxlastunk = old_lastunk;

    /* check the return value */
    if (cnt < 0)
    {
        /* syntax error; return nil to indicate an error */
        runpnil(rcx);
    }
    else if (cnt == 0)
    {
        /* 
         *   No objects found.  Return a list consisting only of the next
         *   index.  If the next index is equal to the starting index,
         *   this will tell the caller that no noun phrase is
         *   syntactically present; otherwise, it will tell the caller
         *   that a noun phrase is present but there are no matching
         *   objects.
         *   
         *   Note that we must increment the returned element index to
         *   conform with the 1-based index values that the game function
         *   uses.  
         */
        ++next;
        voc_push_numlist(ctx, (uint *)&next, 1);
    }
    else
    {
        /*
         *   We found one or more objects.  Return a list whose first
         *   element is the index of the next word to be parsed, and whose
         *   remaining elements are sublists.  Each sublist contains a
         *   match for one noun phrase; for each AND adding another noun
         *   phrase, there's another sublist.  Each sublist contains the
         *   index of the first word of its noun phrase, the index of the
         *   last word of its noun phrase, and then the objects.  For each
         *   object, there is a pair of entries: the object itself, and
         *   the flags for the object.
         *   
         *   First, figure out how much space we need by scanning the
         *   return list.  
         */
        for (lstsiz = 0, i = 0 ; i < cnt ; )
        {
            int j;

            /* 
             *   count the entries in this sublist by looking for the next
             *   entry whose starting word is different 
             */
            for (j = i ;
                 j < cnt && objlist[j].vocolfst == objlist[i].vocolfst ;
                 ++j)
            {
                /* 
                 *   for this entry, we need space for the object (1 + 2
                 *   for an object, or just 1 for nil) and flags (1 + 4) 
                 */
                if (objlist[j].vocolobj == MCMONINV)
                    lstsiz += 1;
                else
                    lstsiz += 3;
                lstsiz += 5;
            }

            /* 
             *   For this sublist, we need space for the first index (type
             *   prefix + number = 1 + 4 = 5) and the last index (5).
             *   We've already counted space for the objects in the list.
             *   Finally, we need space for the list type and length
             *   prefixes (1 + 2) for the sublist itself.  
             */
            lstsiz += (5 + 5) + 3;

            /* skip to the next element */
            i = j;
        }

        /* 
         *   finally, we need space for the first element of the list,
         *   which is the index of the next word to be parsed (1+4)
         */
        lstsiz += 5;

        /* allocate space for the list */
        lstp = voc_push_list_siz(ctx, lstsiz);

        /* 
         *   store the first element - the index of the next word to parse
         *   (adjusting to 1-based indexing) 
         */
        *lstp++ = DAT_NUMBER;
        oswp4s(lstp, next + 1);
        lstp += 4;

        /* build the list */
        for (i = 0 ; i < cnt ; )
        {
            uchar *sublstp;
            int j;
            int firstidx = -1;
            int lastidx = -1;

            /* store the list type prefix */
            *lstp++ = DAT_LIST;

            /* 
             *   remember where the length prefix is, then skip it - we'll
             *   come back and fill it in when we're done with the sublist 
             */
            sublstp = lstp;
            lstp += 2;

            /* search the array to find the indices of the boundary words */
            for (j = 0 ; j < wordcnt ; ++j)
            {
                /* if this is the first word, remember the index */
                if (wordarr[j] == objlist[i].vocolfst)
                    firstidx = j;

                /* if this is the last word, remember the index */
                if (wordarr[j] == objlist[i].vocollst)
                {
                    /* remember the index */
                    lastidx = j;

                    /* 
                     *   we can stop looking now, since the words are
                     *   always in order (so the first index will never be
                     *   after the last index) 
                     */
                    break;
                }
            }

            /* add the first and last index, adjusting to 1-based indexing */
            *lstp++ = DAT_NUMBER;
            oswp4s(lstp, firstidx + 1);
            lstp += 4;
            *lstp++ = DAT_NUMBER;
            oswp4s(lstp, lastidx + 1);
            lstp += 4;

            /* add the objects */
            for (j = i ; 
                 j < cnt && objlist[j].vocolfst == objlist[i].vocolfst ;
                 ++j)
            {
                /* add this object */
                if (objlist[j].vocolobj == MCMONINV)
                {
                    /* just store a nil */
                    *lstp++ = DAT_NIL;
                }
                else
                {
                    /* store the object */
                    *lstp++ = DAT_OBJECT;
                    oswp2(lstp, objlist[j].vocolobj);
                    lstp += 2;
                }

                /* add the flags */
                *lstp++ = DAT_NUMBER;
                oswp4s(lstp, objlist[i].vocolflg);
                lstp += 4;
            }

            /* fix up the sublist's length prefix */
            oswp2(sublstp, lstp - sublstp);

            /* move on to the next sublist */
            i = j;
        }
    }

    /* exit the stack frame */
    voc_leave(ctx, save_sp);
}